

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void ActionUnserialize::
     SerReadWriteMany<ParamsStream<DataStream&,TransactionSerParams>,int&,uint256&,uint256&,unsigned_int&,unsigned_int&,unsigned_int&>
               (ParamsStream<DataStream_&,_TransactionSerParams> *s,int *args,uint256 *args_1,
               uint256 *args_2,uint *args_3,uint *args_4,uint *args_5)

{
  uint256 *__nbytes;
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  DataStream::read(s->m_substream,(int)&local_3c,(void *)0x4,(size_t)args_2);
  *args = local_3c;
  DataStream::read(s->m_substream,(int)args_1,(void *)0x20,(size_t)__nbytes);
  DataStream::read(s->m_substream,(int)args_2,(void *)0x20,(size_t)__nbytes);
  DataStream::read(s->m_substream,(int)&local_3c,(void *)0x4,(size_t)__nbytes);
  *args_3 = local_3c;
  DataStream::read(s->m_substream,(int)&local_3c,(void *)0x4,(size_t)__nbytes);
  *args_4 = local_3c;
  DataStream::read(s->m_substream,(int)&local_3c,(void *)0x4,(size_t)args_4);
  *args_5 = local_3c;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }